

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetBbrDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,BbrDataset *aDataset)

{
  bool bVar1;
  element_type *peVar2;
  Error *aError;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_21;
  BbrDataset *local_20;
  BbrDataset *aDataset_local;
  CommissionerApp *this_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (BbrDataset *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x16])(&local_50,peVar2,local_20);
  aError = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    MergeDataset(&this->mBbrDataset,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetBbrDataset(const BbrDataset &aDataset)
{
    Error error;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(aDataset));
    MergeDataset(mBbrDataset, aDataset);

exit:
    return error;
}